

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O3

IPGMContext * __thiscall
r_exec::IPGMContext::getChild(IPGMContext *__return_storage_ptr__,IPGMContext *this,uint16_t index)

{
  uint16_t uVar1;
  Code *pCVar2;
  View *pVVar3;
  Atom *pAVar4;
  ushort uVar5;
  int iVar6;
  undefined4 extraout_var;
  _Hash_node_base *p_Var7;
  int64_t iVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  
  switch((this->super__Context).data) {
  case STEM:
    uVar1 = (this->super__Context).index;
    pAVar4 = (this->super__Context).code;
    (__return_storage_ptr__->super__Context).overlay = (this->super__Context).overlay;
    (__return_storage_ptr__->super__Context).code = pAVar4;
    (__return_storage_ptr__->super__Context).index = index + uVar1;
    (__return_storage_ptr__->super__Context).data = STEM;
    break;
  case REFERENCE:
    uVar1 = (this->super__Context).index;
    pAVar4 = (this->super__Context).code;
    (__return_storage_ptr__->super__Context).overlay = (this->super__Context).overlay;
    (__return_storage_ptr__->super__Context).code = pAVar4;
    (__return_storage_ptr__->super__Context).index = index + uVar1;
    (__return_storage_ptr__->super__Context).data = REFERENCE;
    break;
  case VIEW:
    pAVar4 = (this->super__Context).code;
    uVar1 = (this->super__Context).index;
    (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
    (__return_storage_ptr__->super__Context).code = pAVar4;
    (__return_storage_ptr__->super__Context).index = index + uVar1;
    (__return_storage_ptr__->super__Context).data = VIEW;
    break;
  case MKS:
    (*(this->object->super__Object)._vptr__Object[0x13])();
    pCVar2 = this->object;
    iVar8 = (pCVar2->markers).used_cells_head;
    if (1 < index) {
      uVar5 = 0;
      do {
        if (iVar8 == -1) {
          (*(pCVar2->super__Object)._vptr__Object[0x14])(pCVar2);
          goto switchD_0015ef56_default;
        }
        uVar5 = uVar5 + 1;
        iVar8 = (pCVar2->markers).cells.
                super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar8].next;
      } while (uVar5 < (ushort)(index - 1));
    }
    (*(pCVar2->super__Object)._vptr__Object[0x14])(pCVar2);
    pCVar2 = (pCVar2->markers).cells.
             super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start[iVar8].data;
    iVar6 = (*(pCVar2->super__Object)._vptr__Object[4])(pCVar2,0);
    (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
    (__return_storage_ptr__->super__Context).code = (Atom *)CONCAT44(extraout_var,iVar6);
    (__return_storage_ptr__->super__Context).index = 0;
    (__return_storage_ptr__->super__Context).data = REFERENCE;
    (__return_storage_ptr__->super__Context)._vptr__Context = (_func_int **)&PTR___Context_001be4a0;
    __return_storage_ptr__->object = pCVar2;
    __return_storage_ptr__->view = (View *)0x0;
    return __return_storage_ptr__;
  case VWS:
    (*(this->object->super__Object)._vptr__Object[0x11])();
    pCVar2 = this->object;
    p_Var7 = (pCVar2->views)._M_h._M_before_begin._M_nxt;
    if (1 < index) {
      uVar5 = 0;
      do {
        if (p_Var7 == (_Hash_node_base *)0x0) {
          (*(pCVar2->super__Object)._vptr__Object[0x12])();
          goto switchD_0015ef56_default;
        }
        uVar5 = uVar5 + 1;
        p_Var7 = p_Var7->_M_nxt;
      } while (uVar5 < (ushort)(index - 1));
    }
    (*(pCVar2->super__Object)._vptr__Object[0x12])();
    pCVar2 = this->object;
    pVVar3 = (View *)p_Var7[1]._M_nxt;
    uVar1 = (this->super__Context).index;
    (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
    (__return_storage_ptr__->super__Context).code = (Atom *)&(pVVar3->super_View).field_0x28;
    (__return_storage_ptr__->super__Context).index = index + uVar1;
    (__return_storage_ptr__->super__Context).data = VIEW;
    (__return_storage_ptr__->super__Context)._vptr__Context = (_func_int **)&PTR___Context_001be4a0;
    __return_storage_ptr__->object = pCVar2;
    __return_storage_ptr__->view = pVVar3;
    return __return_storage_ptr__;
  case VALUE_ARRAY:
    uVar1 = (this->super__Context).index;
    pAVar4 = (this->super__Context).code;
    (__return_storage_ptr__->super__Context).overlay = (this->super__Context).overlay;
    (__return_storage_ptr__->super__Context).code = pAVar4;
    (__return_storage_ptr__->super__Context).index = index + uVar1;
    (__return_storage_ptr__->super__Context).data = VALUE_ARRAY;
    break;
  default:
switchD_0015ef56_default:
    uVar9 = 0;
    uVar10 = 0;
    uVar11 = 0;
    uVar12 = 0;
    (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
    (__return_storage_ptr__->super__Context).code = (Atom *)0x0;
    (__return_storage_ptr__->super__Context).index = 0;
    (__return_storage_ptr__->super__Context).data = UNDEFINED;
    (__return_storage_ptr__->super__Context)._vptr__Context = (_func_int **)&PTR___Context_001be4a0;
    goto LAB_0015f13b;
  }
  (__return_storage_ptr__->super__Context)._vptr__Context = (_func_int **)&PTR___Context_001be4a0;
  uVar9 = *(undefined4 *)&this->object;
  uVar10 = *(undefined4 *)((long)&this->object + 4);
  uVar11 = *(undefined4 *)&this->view;
  uVar12 = *(undefined4 *)((long)&this->view + 4);
LAB_0015f13b:
  *(undefined4 *)&__return_storage_ptr__->object = uVar9;
  *(undefined4 *)((long)&__return_storage_ptr__->object + 4) = uVar10;
  *(undefined4 *)&__return_storage_ptr__->view = uVar11;
  *(undefined4 *)((long)&__return_storage_ptr__->view + 4) = uVar12;
  return __return_storage_ptr__;
}

Assistant:

IPGMContext getChild(uint16_t index) const
    {
        switch (data) {
        case STEM:
            return IPGMContext(object, view, code, this->index + index, (InputLessPGMOverlay *)overlay, STEM);

        case REFERENCE:
            return IPGMContext(object, view, code, this->index + index, (InputLessPGMOverlay *)overlay, REFERENCE);

        case VIEW:
            return IPGMContext(object, view, code, this->index + index, NULL, VIEW);

        case MKS: {
            uint16_t i = 0;
            r_code::list<Code *>::const_iterator m;
            object->acq_markers();

            for (m = object->markers.begin(); i < index - 1; ++i, ++m) {
                if (m == object->markers.end()) { // happens when the list has changed after the call to getChildrenCount.
                    object->rel_markers();
                    return IPGMContext();
                }
            }

            object->rel_markers();
            return IPGMContext(*m, 0);
        }

        case VWS: {
            uint16_t i = 0;
            std::unordered_set<r_code::View *, r_code::View::Hash, r_code::View::Equal>::const_iterator v;
            object->acq_views();

            for (v = object->views.begin(); i < index - 1; ++i, ++v) {
                if (v == object->views.end()) { // happens when the list has changed after the call to getChildrenCount.
                    object->rel_views();
                    return IPGMContext();
                }
            }

            object->rel_views();
            return IPGMContext(object, (r_exec::View*)*v, &(*v)->code(0), this->index + index, NULL, VIEW);
        }

        case VALUE_ARRAY:
            return IPGMContext(object, view, code, this->index + index, (InputLessPGMOverlay *)overlay, VALUE_ARRAY);

        default: // undefined context.
            return IPGMContext();
        }
    }